

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

int __thiscall ot::commissioner::MockSocket::Send(MockSocket *this,ByteArray *aBuf)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  size_type sVar4;
  ByteArray *aBuf_local;
  MockSocket *this_local;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(aBuf);
  if (!bVar1) {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aBuf);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
    iVar2 = (*(this->super_Socket)._vptr_Socket[6])(this,puVar3,sVar4);
    return iVar2;
  }
  abort();
}

Assistant:

int MockSocket::Send(const ByteArray &aBuf)
{
    VerifyOrDie(!aBuf.empty());
    return Send(aBuf.data(), aBuf.size());
}